

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlibemu_opl_inc.c
# Opt level: O0

void change_decayrate(OPL_DATA_conflict *chip,Bitu regbase,op_type_conflict *op_pt)

{
  double dVar1;
  uint uVar2;
  double dVar3;
  double dVar4;
  byte local_3c;
  double f;
  Bits steps;
  Bits decayrate;
  op_type_conflict *op_pt_local;
  Bitu regbase_local;
  OPL_DATA_conflict *chip_local;
  
  uVar2 = chip->adlibreg[regbase + 0x60] & 0xf;
  if ((chip->adlibreg[regbase + 0x60] & 0xf) == 0) {
    op_pt->decaymul = 1.0;
    op_pt->env_step_d = 0;
  }
  else {
    dVar4 = decrelconst[op_pt->toff & 3];
    dVar1 = chip->recipsamp;
    dVar3 = pow(2.0,(double)(uVar2 + (op_pt->toff >> 2)));
    dVar4 = pow(2.0,dVar4 * -7.4493 * dVar1 * dVar3);
    op_pt->decaymul = dVar4;
    uVar2 = uVar2 * 4 + op_pt->toff >> 2;
    if (uVar2 < 0xd) {
      local_3c = 0xc - (char)uVar2;
    }
    else {
      local_3c = 0;
    }
    op_pt->env_step_d = (1 << (local_3c & 0x1f)) + -1;
  }
  return;
}

Assistant:

static void change_decayrate(OPL_DATA* chip, Bitu regbase, op_type* op_pt)
{
	Bits decayrate = chip->adlibreg[ARC_ATTR_DECR+regbase]&15;
	// decaymul should be 1.0 when decayrate==0
	if (decayrate) {
		Bits steps;
		
		fltype f = (fltype)(-7.4493*decrelconst[op_pt->toff&3]*chip->recipsamp);
		op_pt->decaymul = (fltype)(pow(FL2,f*pow(FL2,(fltype)(decayrate+(op_pt->toff>>2)))));
		steps = (decayrate*4 + op_pt->toff) >> 2;
		op_pt->env_step_d = (1<<(steps<=12?12-steps:0))-1;
	}
	else
	{
		op_pt->decaymul = 1.0;
		op_pt->env_step_d = 0;
	}
}